

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

_Bool player_book_has_unlearned_spells(player *p)

{
  wchar_t *pwVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object **item_list;
  class_book_conflict *pcVar4;
  long lVar5;
  size_t item_max;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  item_max = (ulong)z_info->floor_size + (ulong)z_info->pack_size;
  item_list = (object **)mem_zalloc((ulong)(uint)((int)item_max * 8));
  uVar8 = 0;
  if (p->upkeep->new_spells != L'\0') {
    wVar3 = scan_items(item_list,item_max,p,L'\x06',obj_can_study);
    uVar6 = (ulong)(uint)wVar3;
    if (wVar3 < L'\x01') {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      pcVar4 = player_object_to_book(p,item_list[uVar8]);
      if (pcVar4 != (class_book_conflict *)0x0) {
        lVar5 = -1;
        lVar7 = 0x20;
        while (lVar5 = lVar5 + 1, lVar5 < pcVar4->num_spells) {
          pwVar1 = (wchar_t *)((long)&pcVar4->spells->name + lVar7);
          lVar7 = lVar7 + 0x38;
          _Var2 = spell_okay_to_study(p,*pwVar1);
          if (_Var2) {
            uVar8 = 1;
            goto LAB_001a23be;
          }
        }
      }
    }
    uVar8 = 0;
  }
LAB_001a23be:
  mem_free(item_list);
  return SUB81(uVar8,0);
}

Assistant:

bool player_book_has_unlearned_spells(struct player *p)
{
	int i, j;
	int item_max = z_info->pack_size + z_info->floor_size;
	struct object **item_list = mem_zalloc(item_max * sizeof(struct object *));
	int item_num;

	/* Check if the player can learn new spells */
	if (!p->upkeep->new_spells) {
		mem_free(item_list);
		return false;
	}

	/* Check through all available books */
	item_num = scan_items(item_list, item_max, p, USE_INVEN | USE_FLOOR,
		obj_can_study);
	for (i = 0; i < item_num; i++) {
		const struct class_book *book = player_object_to_book(p, item_list[i]);
		if (!book) continue;

		/* Extract spells */
		for (j = 0; j < book->num_spells; j++)
			if (spell_okay_to_study(p, book->spells[j].sidx)) {
				/* There is a spell the player can study */
				mem_free(item_list);
				return true;
			}
	}

	mem_free(item_list);
	return false;
}